

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall wasm::DataFlow::Graph::doVisitBlock(Graph *this,Block *curr)

{
  mapped_type pEVar1;
  size_t sVar2;
  char *__code;
  mapped_type *ppEVar3;
  __node_base_ptr p_Var4;
  ulong uVar5;
  vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
  *this_00;
  Block *local_38;
  
  pEVar1 = this->parent;
  local_38 = curr;
  ppEVar3 = std::__detail::
            _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->expressionParentMap,(key_type *)&local_38);
  *ppEVar3 = pEVar1;
  this->parent = (Expression *)curr;
  sVar2 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (sVar2 != 0) {
    uVar5 = 0;
    do {
      if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar5) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                 (curr->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [uVar5]);
      uVar5 = uVar5 + 1;
    } while (sVar2 != uVar5);
  }
  __code = (curr->name).super_IString.str._M_str;
  if (__code != (char *)0x0) {
    p_Var4 = std::
             _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->breakStates)._M_h,
                        (ulong)__code % (this->breakStates)._M_h._M_bucket_count,&curr->name,
                        (__hash_code)__code);
    if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
      this_00 = (vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                 *)(p_Var4->_M_nxt + 3);
      if ((this->locals).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->locals).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
        ::push_back(this_00,&this->locals);
      }
      mergeBlock(this,this_00,&this->locals);
    }
  }
  this->parent = pEVar1;
  return &this->bad;
}

Assistant:

Node* doVisitBlock(Block* curr) {
    // TODO: handle super-deep nesting
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    for (auto* child : curr->list) {
      visit(child);
    }
    // Merge the outputs
    // TODO handle conditions on these breaks
    if (curr->name.is()) {
      auto iter = breakStates.find(curr->name);
      if (iter != breakStates.end()) {
        auto& states = iter->second;
        // Add the state flowing out
        if (!isInUnreachable()) {
          states.push_back(locals);
        }
        mergeBlock(states, locals);
      }
    }
    parent = oldParent;
    return &bad;
  }